

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp)

{
  pointer puVar1;
  Block *this_00;
  If *pIVar2;
  bool bVar3;
  Expression **ppEVar4;
  mapped_type *pmVar5;
  LocalSet *this_01;
  Expression *pEVar6;
  LocalGet *pLVar7;
  ulong index;
  MixedArena *this_02;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  If *local_68;
  If *iff_local;
  Type localType;
  _Rb_tree_color local_44;
  MixedArena *pMStack_40;
  Index goodIndex;
  Expression **local_38;
  
  if ((((iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id == 0) &&
      ((iff->ifTrue->type).id == 0)) &&
     ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_44 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    local_68 = iff;
    iff_local = (If *)Function::getLocalType
                                ((this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .currFunction,local_44);
    bVar3 = wasm::Type::isDefaultable((Type *)&iff_local);
    if (bVar3) {
      this_00 = (Block *)iff->ifTrue;
      if ((((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
            BlockId) && ((this_00->name).super_IString.str._M_str == (char *)0x0)) &&
         ((this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
          .usedElements != 0)) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(this_00->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
        if ((*ppEVar4)->_id == NopId) {
          this_02 = &((this->
                      super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                      ).
                      super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      .
                      super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      .
                      super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .currModule)->allocator;
          pMStack_40 = (MixedArena *)&this_00->list;
          pmVar5 = std::
                   map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                   ::at(&this->sinkables,&local_44);
          local_38 = pmVar5->item;
          this_01 = Expression::cast<wasm::LocalSet>(*local_38);
          localType.id = (uintptr_t)this_01->value;
          index = (this_00->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements - 1;
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)pMStack_40,index);
          *ppEVar4 = (Expression *)localType.id;
          pMStack_40 = this_02;
          pEVar6 = (Expression *)MixedArena::alloc<wasm::Nop>(this_02);
          *local_38 = pEVar6;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
          Block::finalize(this_00,type_,Unknown);
          pIVar2 = iff_local;
          if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
              == 0) {
            __assert_fail("ifTrueBlock->type != Type::none",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                          ,0x33a,
                          "void wasm::SimplifyLocals<>::optimizeIfReturn(If *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                         );
          }
          local_38 = (Expression **)CONCAT44(local_38._4_4_,this_01->index);
          pLVar7 = MixedArena::alloc<wasm::LocalGet>(pMStack_40);
          pLVar7->index = (Index)local_38;
          (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
               (uintptr_t)pIVar2;
          iff->ifFalse = (Expression *)pLVar7;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
          If::finalize(iff,type__00);
          puVar1 = (this->getCounter).num.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + this_01->index;
          *puVar1 = *puVar1 + 1;
          if ((iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 0
             ) {
            this_01->value = (Expression *)iff;
            LocalSet::finalize(this_01);
            *currp = (Expression *)this_01;
            this->anotherCycle = true;
            return;
          }
          __assert_fail("iff->type != Type::none",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x340,
                        "void wasm::SimplifyLocals<>::optimizeIfReturn(If *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
      }
      std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back(&this->ifsToEnlarge,&local_68)
      ;
    }
  }
  return;
}

Assistant:

void optimizeIfReturn(If* iff, Expression** currp) {
    // If this if is unreachable code, we have nothing to do.
    if (iff->type != Type::none || iff->ifTrue->type != Type::none) {
      return;
    }
    // Anything sinkable is good for us.
    if (sinkables.empty()) {
      return;
    }

    // Check if the type makes sense. A non-nullable local might be dangerous
    // here, as creating new local.gets for such locals is risky:
    //
    //  (func $silly
    //    (local $x (ref $T))
    //    (if
    //      (condition)
    //      (local.set $x ..)
    //    )
    //  )
    //
    // That local is silly as the write is never read. If we optimize it and add
    // a local.get, however, then we'd no longer validate (as no set would
    // dominate that new get in the if's else arm). Fixups would add a
    // ref.as_non_null around the local.get, which will then trap at runtime:
    //
    //  (func $silly
    //    (local $x (ref null $T))
    //    (local.set $x
    //      (if
    //        (condition)
    //        (..)
    //        (ref.as_non_null
    //          (local.get $x)
    //        )
    //      )
    //    )
    //  )
    //
    // In other words, local.get is not necessarily free of effects if the local
    // is non-nullable - it must have been set already. We could check that
    // here, but running that linear-time check may not be worth it as this
    // optimization is fairly minor, so just skip the non-nullable case (and in
    // general, the non-defaultable case, of say a tuple with a non-nullable
    // element).
    //
    // TODO investigate more
    Index goodIndex = sinkables.begin()->first;
    auto localType = this->getFunction()->getLocalType(goodIndex);
    if (!localType.isDefaultable()) {
      return;
    }

    // Ensure we have a place to write the return values for, if not, we
    // need another cycle.
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (!ifTrueBlock || ifTrueBlock->name.is() ||
        ifTrueBlock->list.size() == 0 || !ifTrueBlock->list.back()->is<Nop>()) {
      ifsToEnlarge.push_back(iff);
      return;
    }

    // We can optimize!

    // Update the ifTrue side.
    Builder builder(*this->getModule());
    auto** item = sinkables.at(goodIndex).item;
    auto* set = (*item)->template cast<LocalSet>();
    ifTrueBlock->list[ifTrueBlock->list.size() - 1] = set->value;
    *item = builder.makeNop();
    ifTrueBlock->finalize();
    assert(ifTrueBlock->type != Type::none);
    // Update the ifFalse side.
    iff->ifFalse = builder.makeLocalGet(set->index, localType);
    iff->finalize(); // update type
    // Update the get count.
    getCounter.num[set->index]++;
    assert(iff->type != Type::none);
    // Finally, reuse the local.set on the iff itself.
    set->value = iff;
    set->finalize();
    *currp = set;
    anotherCycle = true;
  }